

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids,
          Graph *nodes2ents)

{
  int *piVar1;
  Alloc *this_00;
  Alloc *this_01;
  Alloc *this_02;
  undefined8 uVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar4;
  Read<signed_char> RVar5;
  Read<signed_char> eq_marks;
  Alloc *local_60;
  void *local_58;
  Read<signed_char> local_50;
  Graph local_40;
  void *pvVar3;
  
  if ((nodes2ents->a2ab).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    pcVar4 = "nodes2ents.a2ab.exists()";
    uVar2 = 0x8f;
  }
  else {
    if ((nodes2ents->ab2b).write_.shared_alloc_.direct_ptr != (void *)0x0) {
      get_eq_marks((Omega_h *)&local_60,mesh,class_dim,class_ids);
      local_40.a2ab.write_.shared_alloc_.alloc = (nodes2ents->a2ab).write_.shared_alloc_.alloc;
      if (((ulong)local_40.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_40.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      this_01 = local_40.a2ab.write_.shared_alloc_.alloc;
      local_40.a2ab.write_.shared_alloc_.direct_ptr =
           (nodes2ents->a2ab).write_.shared_alloc_.direct_ptr;
      local_40.ab2b.write_.shared_alloc_.alloc = (nodes2ents->ab2b).write_.shared_alloc_.alloc;
      if (((ulong)local_40.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_40.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      this_02 = local_40.ab2b.write_.shared_alloc_.alloc;
      local_40.ab2b.write_.shared_alloc_.direct_ptr =
           (nodes2ents->ab2b).write_.shared_alloc_.direct_ptr;
      local_50.write_.shared_alloc_.alloc = local_60;
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
        }
        else {
          local_60->use_count = local_60->use_count + 1;
        }
      }
      this_00 = local_50.write_.shared_alloc_.alloc;
      local_50.write_.shared_alloc_.direct_ptr = local_58;
      RVar5 = mark_down(this,&local_40,&local_50);
      pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
      if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
        piVar1 = &this_00->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_00);
          operator_delete(this_00,0x48);
          pvVar3 = extraout_RDX;
        }
      }
      if (((ulong)this_02 & 7) == 0 && this_02 != (Alloc *)0x0) {
        piVar1 = &this_02->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_02);
          operator_delete(this_02,0x48);
          pvVar3 = extraout_RDX_00;
        }
      }
      if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
        piVar1 = &this_01->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_01);
          operator_delete(this_01,0x48);
          pvVar3 = extraout_RDX_01;
        }
      }
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        piVar1 = &local_60->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60);
          operator_delete(local_60,0x48);
          pvVar3 = extraout_RDX_02;
        }
      }
      RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
      RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar5.write_.shared_alloc_;
    }
    pcVar4 = "nodes2ents.ab2b.exists()";
    uVar2 = 0x90;
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uVar2);
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}